

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O0

void cf_scache_peer_remove_expired(Curl_ssl_scache_peer *peer,curl_off_t now)

{
  _Bool _Var1;
  Curl_ssl_session *s_00;
  Curl_ssl_session *s;
  Curl_llist_node *n;
  curl_off_t now_local;
  Curl_ssl_scache_peer *peer_local;
  
  s = (Curl_ssl_session *)Curl_llist_head(&peer->sessions);
  while (s != (Curl_ssl_session *)0x0) {
    s_00 = (Curl_ssl_session *)Curl_node_elem((Curl_llist_node *)s);
    s = (Curl_ssl_session *)Curl_node_next((Curl_llist_node *)s);
    _Var1 = cf_scache_session_expired(s_00,now);
    if (_Var1) {
      cf_scache_session_remove(peer,s_00);
    }
  }
  return;
}

Assistant:

static void cf_scache_peer_remove_expired(struct Curl_ssl_scache_peer *peer,
                                          curl_off_t now)
{
  struct Curl_llist_node *n = Curl_llist_head(&peer->sessions);
  while(n) {
    struct Curl_ssl_session *s = Curl_node_elem(n);
    n = Curl_node_next(n);
    if(cf_scache_session_expired(s, now))
      cf_scache_session_remove(peer, s);
  }
}